

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_mm_equal(jit_State *J,RecordIndex *ix,int op)

{
  int iVar1;
  TRef TVar2;
  TRef mt2_1;
  TRef mt2;
  TValue mo1v;
  TValue *pTStack_f8;
  TRef mo1;
  cTValue *bv;
  RecordIndex *pRStack_e8;
  int op_local;
  RecordIndex *ix_local;
  jit_State *J_local;
  RecordIndex *local_d0;
  undefined2 local_c6;
  undefined2 local_c4;
  undefined2 local_c2;
  RecordIndex *local_c0;
  undefined2 local_b6;
  undefined2 local_b4;
  undefined2 local_b2;
  RecordIndex *local_b0;
  undefined2 local_a6;
  undefined2 local_a4;
  undefined2 local_a2;
  RecordIndex *local_a0;
  TValue *local_98;
  RecordIndex *local_90;
  undefined8 local_88;
  TValue *local_80;
  TRef *local_78;
  undefined8 local_70;
  TValue *local_68;
  RecordIndex *local_60;
  lua_State *local_58;
  char *local_50;
  RecordIndex *local_48;
  lua_State *local_40;
  char *local_38;
  TRef *local_30;
  undefined8 local_28;
  char *local_20;
  RecordIndex *local_18;
  undefined8 local_10;
  
  ix->tab = ix->val;
  local_58 = J->L;
  local_68 = &ix->valv;
  ix->tabv = *local_68;
  local_50 = "copy of dead GC object";
  bv._4_4_ = op;
  pRStack_e8 = ix;
  ix_local = (RecordIndex *)J;
  local_60 = ix;
  local_48 = ix;
  local_40 = local_58;
  iVar1 = lj_record_mm_lookup(J,ix,MM_eq);
  if (iVar1 != 0) {
    mo1v.field_4.it = pRStack_e8->mobj;
    local_70._0_4_ = ix_local[1].val;
    local_70._4_4_ = ix_local[1].mt;
    local_80 = &pRStack_e8->mobjv;
    local_78 = &mt2_1;
    _mt2_1 = *local_80;
    local_38 = "copy of dead GC object";
    pTStack_f8 = &pRStack_e8->keyv;
    local_30 = local_78;
    local_28 = local_70;
    if (((int)(pTStack_f8->field_4).it >> 0xf == -0xc) &&
       (*(GCtab **)((pTStack_f8->u64 & 0x7fffffffffff) + 0x20) == pRStack_e8->mtv)) {
      local_a0 = ix_local;
      local_a2 = 0x450b;
      local_a4 = (undefined2)pRStack_e8->key;
      local_a6 = 5;
      *(undefined2 *)((long)&ix_local[2].oldv + 4) = 0x450b;
      *(undefined2 *)&ix_local[2].oldv = local_a4;
      *(undefined2 *)((long)&ix_local[2].oldv + 2) = 5;
      TVar2 = lj_opt_fold((jit_State *)ix_local);
      local_b4 = (undefined2)TVar2;
      local_b0 = ix_local;
      local_b2 = 0x88b;
      local_b6 = (undefined2)pRStack_e8->mt;
      *(undefined2 *)((long)&ix_local[2].oldv + 4) = 0x88b;
      *(undefined2 *)&ix_local[2].oldv = local_b4;
      *(undefined2 *)((long)&ix_local[2].oldv + 2) = local_b6;
      lj_opt_fold((jit_State *)ix_local);
    }
    else if (((int)(pTStack_f8->field_4).it >> 0xf == -0xd) &&
            (*(GCtab **)((pTStack_f8->u64 & 0x7fffffffffff) + 0x20) == pRStack_e8->mtv)) {
      local_c0 = ix_local;
      local_c2 = 0x450b;
      local_c4 = (undefined2)pRStack_e8->key;
      local_c6 = 0xb;
      *(undefined2 *)((long)&ix_local[2].oldv + 4) = 0x450b;
      *(undefined2 *)&ix_local[2].oldv = local_c4;
      *(undefined2 *)((long)&ix_local[2].oldv + 2) = 0xb;
      TVar2 = lj_opt_fold((jit_State *)ix_local);
      J_local._4_2_ = (undefined2)TVar2;
      local_d0 = ix_local;
      J_local._6_2_ = 0x88b;
      J_local._2_2_ = (undefined2)pRStack_e8->mt;
      *(undefined2 *)((long)&ix_local[2].oldv + 4) = 0x88b;
      *(undefined2 *)&ix_local[2].oldv = J_local._4_2_;
      *(undefined2 *)((long)&ix_local[2].oldv + 2) = J_local._2_2_;
      lj_opt_fold((jit_State *)ix_local);
    }
    else {
      pRStack_e8->tab = pRStack_e8->key;
      local_88._0_4_ = ix_local[1].val;
      local_88._4_4_ = ix_local[1].mt;
      local_90 = pRStack_e8;
      (pRStack_e8->tabv).field_4 = *(anon_struct_8_2_7fa0a05d_for_TValue_4 *)pTStack_f8;
      local_18 = pRStack_e8;
      local_20 = "copy of dead GC object";
      local_98 = pTStack_f8;
      local_10 = local_88;
      iVar1 = lj_record_mm_lookup((jit_State *)ix_local,pRStack_e8,MM_eq);
      if (iVar1 == 0) {
        return;
      }
      iVar1 = lj_record_objcmp((jit_State *)ix_local,mo1v.field_4.it,pRStack_e8->mobj,
                               (cTValue *)&mt2_1,&pRStack_e8->mobjv);
      if (iVar1 != 0) {
        return;
      }
    }
    rec_mm_callcomp((jit_State *)ix_local,pRStack_e8,bv._4_4_);
  }
  return;
}

Assistant:

static void rec_mm_equal(jit_State *J, RecordIndex *ix, int op)
{
  ix->tab = ix->val;
  copyTV(J->L, &ix->tabv, &ix->valv);
  if (lj_record_mm_lookup(J, ix, MM_eq)) {  /* Lookup mm on 1st operand. */
    cTValue *bv;
    TRef mo1 = ix->mobj;
    TValue mo1v;
    copyTV(J->L, &mo1v, &ix->mobjv);
    /* Avoid the 2nd lookup and the objcmp if the metatables are equal. */
    bv = &ix->keyv;
    if (tvistab(bv) && tabref(tabV(bv)->metatable) == ix->mtv) {
      TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_TAB_META);
      emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
    } else if (tvisudata(bv) && tabref(udataV(bv)->metatable) == ix->mtv) {
      TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_UDATA_META);
      emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
    } else {  /* Lookup metamethod on 2nd operand and compare both. */
      ix->tab = ix->key;
      copyTV(J->L, &ix->tabv, bv);
      if (!lj_record_mm_lookup(J, ix, MM_eq) ||
	  lj_record_objcmp(J, mo1, ix->mobj, &mo1v, &ix->mobjv))
	return;
    }
    rec_mm_callcomp(J, ix, op);
  }
}